

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall helics::CoreBroker::transmitDelayedMessages(CoreBroker *this)

{
  bool bVar1;
  ActionMessage *pAVar2;
  optional<helics::ActionMessage> *in_RDI;
  optional<helics::ActionMessage> msg;
  optional<helics::ActionMessage> *poVar3;
  SimpleQueue<helics::ActionMessage,_std::mutex> *in_stack_fffffffffffffe88;
  GlobalFederateId local_cc;
  optional<helics::ActionMessage> local_c8;
  
  gmlc::containers::SimpleQueue<helics::ActionMessage,_std::mutex>::pop(in_stack_fffffffffffffe88);
  while( true ) {
    bVar1 = std::optional::operator_cast_to_bool((optional<helics::ActionMessage> *)0x5dd6dd);
    if (!bVar1) break;
    GlobalFederateId::GlobalFederateId
              (&local_cc,
               (GlobalBrokerId)
               (in_RDI->super__Optional_base<helics::ActionMessage,_false,_false>)._M_payload.
               super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
               super__Optional_payload_base<helics::ActionMessage>._M_payload._M_value.dest_handle.
               hid);
    poVar3 = &local_c8;
    pAVar2 = std::optional<helics::ActionMessage>::operator->
                       ((optional<helics::ActionMessage> *)0x5dd71a);
    (pAVar2->source_id).gid = local_cc.gid;
    pAVar2 = std::optional<helics::ActionMessage>::operator*
                       ((optional<helics::ActionMessage> *)0x5dd738);
    (**(code **)(*(long *)&(in_RDI->super__Optional_base<helics::ActionMessage,_false,_false>).
                           _M_payload.
                           super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
                           super__Optional_payload_base<helics::ActionMessage>._M_payload + 0x110))
              (in_RDI,0,pAVar2);
    gmlc::containers::SimpleQueue<helics::ActionMessage,_std::mutex>::pop(in_stack_fffffffffffffe88)
    ;
    std::optional<helics::ActionMessage>::operator=(in_RDI,poVar3);
    std::optional<helics::ActionMessage>::~optional((optional<helics::ActionMessage> *)0x5dd789);
  }
  std::optional<helics::ActionMessage>::~optional((optional<helics::ActionMessage> *)0x5dd7be);
  return;
}

Assistant:

void CoreBroker::transmitDelayedMessages()
{
    auto msg = delayTransmitQueue.pop();
    while (msg) {
        msg->source_id = global_broker_id_local;
        transmit(parent_route_id, *msg);
        msg = delayTransmitQueue.pop();
    }
}